

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

int pty_compare_by_pid(void *av,void *bv)

{
  Pty *b;
  Pty *a;
  void *bv_local;
  void *av_local;
  
  if (*(int *)((long)av + 0x1078) < *(int *)((long)bv + 0x1078)) {
    av_local._4_4_ = -1;
  }
  else if (*(int *)((long)bv + 0x1078) < *(int *)((long)av + 0x1078)) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int pty_compare_by_pid(void *av, void *bv)
{
    Pty *a = (Pty *)av;
    Pty *b = (Pty *)bv;

    if (a->child_pid < b->child_pid)
        return -1;
    else if (a->child_pid > b->child_pid)
        return +1;
    return 0;
}